

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

int ON_Buffer::Compare(ON_Buffer *a,ON_Buffer *b)

{
  ulong uVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ON_BUFFER_SEGMENT *local_48;
  ON_BUFFER_SEGMENT *local_40;
  
  iVar3 = 0;
  if (a != b) {
    uVar1 = a->m_buffer_size;
    iVar3 = -1;
    if (b->m_buffer_size <= uVar1) {
      if (b->m_buffer_size < uVar1) {
LAB_0045a818:
        iVar3 = 1;
      }
      else {
        local_40 = a->m_first_segment;
        local_48 = b->m_first_segment;
        iVar3 = 0;
        if (uVar1 != 0 &&
            (local_48 != (ON_BUFFER_SEGMENT *)0x0 && local_40 != (ON_BUFFER_SEGMENT *)0x0)) {
          uVar9 = 0;
          uVar10 = 0;
          uVar8 = 0;
          uVar6 = 0;
LAB_0045a85f:
          uVar7 = 0;
          do {
            if (uVar7 == 0) {
              uVar7 = local_40->m_segment_position1 - local_40->m_segment_position0;
              if (local_40->m_segment_position1 < local_40->m_segment_position0 || uVar7 == 0)
              goto LAB_0045a93c;
              uVar8 = 0;
            }
            if (uVar9 == 0) {
              uVar9 = local_48->m_segment_position1 - local_48->m_segment_position0;
              if (local_48->m_segment_position0 <= local_48->m_segment_position1 && uVar9 != 0) {
                uVar10 = 0;
                goto LAB_0045a897;
              }
LAB_0045a918:
              local_48 = local_48->m_next_segment;
              if (local_48 == (ON_BUFFER_SEGMENT *)0x0) {
                return 0;
              }
              uVar9 = 0;
            }
            else {
LAB_0045a897:
              uVar5 = uVar7 - uVar8;
              if (uVar7 < uVar8 || uVar5 == 0) goto LAB_0045a93c;
              uVar4 = uVar9 - uVar10;
              if (uVar9 < uVar10 || uVar4 == 0) goto LAB_0045a918;
              puVar2 = local_48->m_segment_buffer;
              if (local_40->m_segment_buffer == (uchar *)0x0) {
                return -(uint)(puVar2 != (uchar *)0x0);
              }
              if (puVar2 == (uchar *)0x0) goto LAB_0045a818;
              if (uVar5 < uVar4) {
                uVar4 = uVar5;
              }
              __n = uVar1 - uVar6;
              if (uVar4 + uVar6 <= uVar1) {
                __n = uVar4;
              }
              iVar3 = memcmp(local_40->m_segment_buffer + uVar8,puVar2 + uVar10,__n);
              if (iVar3 != 0) {
                return iVar3 >> 0x1f | 1;
              }
              uVar8 = uVar8 + __n;
              uVar10 = uVar10 + __n;
              uVar6 = uVar6 + __n;
            }
            if (uVar1 <= uVar6) {
              return 0;
            }
          } while( true );
        }
      }
    }
  }
  return iVar3;
LAB_0045a93c:
  local_40 = local_40->m_next_segment;
  if (local_40 == (ON_BUFFER_SEGMENT *)0x0) {
    return 0;
  }
  if (local_48 == (ON_BUFFER_SEGMENT *)0x0) {
    return 0;
  }
  if (uVar1 <= uVar6) {
    return 0;
  }
  goto LAB_0045a85f;
}

Assistant:

int ON_Buffer::Compare( const ON_Buffer& a, const ON_Buffer& b )
{
  if ( &a == &b )
    return 0;
  if ( a.m_buffer_size < b.m_buffer_size )
    return -1;
  if ( a.m_buffer_size > b.m_buffer_size )
    return 1;

  struct ON_BUFFER_SEGMENT* aseg = a.m_first_segment;
  struct ON_BUFFER_SEGMENT* bseg = b.m_first_segment;
  const ON__UINT64 buffer_size = a.m_buffer_size;
  ON__UINT64 size = 0;
  size_t aoffset = 0;
  size_t boffset = 0;
  size_t asegsize = 0;
  size_t bsegsize = 0;  
  size_t asize = 0;
  size_t bsize = 0;  
  size_t sz;
  int rc = 0;

  while ( 0 != aseg && 0 != bseg && size < buffer_size )
  {
    if ( 0 == asegsize )
    {
      if ( aseg->m_segment_position0 >= aseg->m_segment_position1 )
      {
        aseg = aseg->m_next_segment;
        continue;
      }
      asegsize = (size_t)(aseg->m_segment_position1 - aseg->m_segment_position0);
      aoffset = 0;
    }

    if ( 0 == bsegsize )
    {
      if ( bseg->m_segment_position0 >= bseg->m_segment_position1 )
      {
        bseg = bseg->m_next_segment;
        continue;
      }
      bsegsize = (size_t)(bseg->m_segment_position1 - bseg->m_segment_position0);
      boffset = 0;
    }
    
    if ( aoffset >= asegsize )
    {
      asegsize = 0;
      aseg = aseg->m_next_segment;
      continue;
    }

    if ( boffset >= bsegsize )
    {
      bsegsize = 0;
      bseg = bseg->m_next_segment;
      continue;
    }

    if ( 0 == aseg->m_segment_buffer )
    {
      return (0 == bseg->m_segment_buffer) ? 0 : -1;
    }

    if ( 0 == bseg->m_segment_buffer )
    {
      return 1;
    }

    asize = asegsize - aoffset;
    bsize = bsegsize - boffset;
    sz = (asize <= bsize) ? asize : bsize;
    if ( size + sz > buffer_size )
      sz = (size_t)(buffer_size - size);
    rc = memcmp( aseg->m_segment_buffer + aoffset, bseg->m_segment_buffer + boffset, (size_t)sz );
    if ( 0 != rc )
      return ((rc<0)?-1:1);
    aoffset += sz;
    boffset += sz;
    size += sz;
  }

  return 0;
}